

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void iadst8x8_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  int in_R8D;
  uint in_R9D;
  undefined4 in_register_0000008c;
  int iVar37;
  int iVar40;
  int iVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar42;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int log_range_out;
  __m128i temp2;
  __m128i temp1;
  __m128i x;
  __m128i u [8];
  __m128i kZero;
  __m128i rnding;
  __m128i cospi32;
  __m128i cospi48;
  __m128i cospi16;
  __m128i cospi60;
  __m128i cospi4;
  int32_t *cospi;
  __m128i *in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8b0;
  undefined8 uVar43;
  undefined8 local_738;
  undefined8 uStack_730;
  int local_71c;
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  int local_6e8;
  int iStack_6e4;
  int iStack_6e0;
  int iStack_6dc;
  int local_6d8;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  int local_6c8;
  int iStack_6c4;
  int iStack_6c0;
  int iStack_6bc;
  int local_6b8;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  int local_698;
  int iStack_694;
  int iStack_690;
  int iStack_68c;
  int local_688;
  int iStack_684;
  int iStack_680;
  int iStack_67c;
  int local_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  int32_t *local_5f8;
  uint local_5f0;
  int local_5ec;
  int local_5e8;
  uint local_5e4;
  undefined8 *local_5e0;
  undefined1 (*local_5d8) [16];
  uint local_5cc;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  uint local_5ac;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  uint local_58c;
  undefined8 local_588;
  undefined8 uStack_580;
  uint local_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  uint local_54c;
  undefined8 local_548;
  undefined8 uStack_540;
  uint local_52c;
  undefined8 local_528;
  undefined8 uStack_520;
  uint local_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  uint local_4ec;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  int local_268;
  int local_264;
  int local_260;
  int32_t local_25c;
  int32_t local_258;
  int32_t local_254;
  int32_t local_250;
  int32_t local_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  int32_t local_f8;
  int32_t local_f4;
  int32_t local_f0;
  int32_t local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int32_t local_d8;
  int32_t local_d4;
  int32_t local_d0;
  int32_t local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int32_t local_b8;
  int32_t local_b4;
  int32_t local_b0;
  int32_t local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int32_t local_98;
  int32_t local_94;
  int32_t local_90;
  int32_t local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int32_t local_78;
  int32_t local_74;
  int32_t local_70;
  int32_t local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_5f0 = in_R9D;
  local_5ec = in_R8D;
  local_5e8 = in_ECX;
  local_5e4 = in_EDX;
  local_5e0 = in_RSI;
  local_5d8 = in_RDI;
  local_5f8 = cospi_arr(in_EDX);
  local_24c = local_5f8[4];
  local_608 = CONCAT44(local_24c,local_24c);
  uStack_600 = CONCAT44(local_24c,local_24c);
  local_250 = local_5f8[0x3c];
  local_618 = CONCAT44(local_250,local_250);
  uStack_610 = CONCAT44(local_250,local_250);
  local_254 = local_5f8[0x10];
  local_628 = CONCAT44(local_254,local_254);
  uStack_620 = CONCAT44(local_254,local_254);
  local_258 = local_5f8[0x30];
  local_638 = CONCAT44(local_258,local_258);
  uStack_630 = CONCAT44(local_258,local_258);
  local_25c = local_5f8[0x20];
  local_648 = CONCAT44(local_25c,local_25c);
  uStack_640 = CONCAT44(local_25c,local_25c);
  local_260 = 1 << ((char)local_5e4 - 1U & 0x1f);
  local_658 = CONCAT44(local_260,local_260);
  uStack_650 = CONCAT44(local_260,local_260);
  local_278 = 0;
  uStack_270 = 0;
  local_668 = 0;
  uStack_660 = 0;
  local_118 = *(undefined8 *)*local_5d8;
  uStack_110 = *(undefined8 *)(*local_5d8 + 8);
  auVar16._8_8_ = uStack_610;
  auVar16._0_8_ = local_618;
  auVar38 = pmulld(*local_5d8,auVar16);
  local_6f8._0_8_ = auVar38._0_8_;
  local_6f8._8_8_ = auVar38._8_8_;
  local_388 = local_6f8._0_8_;
  uVar29 = local_388;
  uStack_380 = local_6f8._8_8_;
  uVar30 = uStack_380;
  local_388._0_4_ = auVar38._0_4_;
  local_388._4_4_ = auVar38._4_4_;
  uStack_380._0_4_ = auVar38._8_4_;
  uStack_380._4_4_ = auVar38._12_4_;
  local_4e8 = CONCAT44(local_388._4_4_ + local_260,(int)local_388 + local_260);
  uStack_4e0 = CONCAT44(uStack_380._4_4_ + local_260,(int)uStack_380 + local_260);
  local_4ec = local_5e4;
  auVar38 = ZEXT416(local_5e4);
  local_6e8 = (int)local_388 + local_260 >> auVar38;
  iStack_6e4 = local_388._4_4_ + local_260 >> auVar38;
  iStack_6e0 = (int)uStack_380 + local_260 >> auVar38;
  iStack_6dc = uStack_380._4_4_ + local_260 >> auVar38;
  local_138 = *(undefined8 *)*local_5d8;
  uStack_130 = *(undefined8 *)(*local_5d8 + 8);
  auVar15._8_8_ = uStack_600;
  auVar15._0_8_ = local_608;
  auVar38 = pmulld(*local_5d8,auVar15);
  local_6f8._0_8_ = auVar38._0_8_;
  local_6f8._8_8_ = auVar38._8_8_;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = local_6f8._0_8_;
  uVar35 = local_298;
  uStack_290 = local_6f8._8_8_;
  uVar36 = uStack_290;
  local_298._0_4_ = auVar38._0_4_;
  local_298._4_4_ = auVar38._4_4_;
  uStack_290._0_4_ = auVar38._8_4_;
  uStack_290._4_4_ = auVar38._12_4_;
  local_3a8 = CONCAT44(-local_298._4_4_,-(int)local_298);
  uStack_3a0 = CONCAT44(-uStack_290._4_4_,-(int)uStack_290);
  local_6d8 = -(int)local_298 + local_260;
  iStack_6d4 = -local_298._4_4_ + local_260;
  iStack_6d0 = -(int)uStack_290 + local_260;
  iStack_6cc = -uStack_290._4_4_ + local_260;
  local_508 = CONCAT44(iStack_6d4,local_6d8);
  uStack_500 = CONCAT44(iStack_6cc,iStack_6d0);
  local_50c = local_5e4;
  auVar38 = ZEXT416(local_5e4);
  local_6d8 = local_6d8 >> auVar38;
  iStack_6d4 = iStack_6d4 >> auVar38;
  iStack_6d0 = iStack_6d0 >> auVar38;
  iStack_6cc = iStack_6cc >> auVar38;
  local_158 = CONCAT44(iStack_6e4,local_6e8);
  uStack_150 = CONCAT44(iStack_6dc,iStack_6e0);
  auVar14._8_8_ = uStack_150;
  auVar14._0_8_ = local_158;
  auVar13._8_8_ = uStack_620;
  auVar13._0_8_ = local_628;
  auVar38 = pmulld(auVar14,auVar13);
  local_178 = CONCAT44(iStack_6d4,local_6d8);
  uStack_170 = CONCAT44(iStack_6cc,iStack_6d0);
  auVar12._8_8_ = uStack_170;
  auVar12._0_8_ = local_178;
  auVar11._8_8_ = uStack_630;
  auVar11._0_8_ = local_638;
  auVar39 = pmulld(auVar12,auVar11);
  local_708._0_8_ = auVar38._0_8_;
  local_708._8_8_ = auVar38._8_8_;
  local_6f8._0_8_ = auVar39._0_8_;
  local_6f8._8_8_ = auVar39._8_8_;
  local_3c8 = local_708._0_8_;
  uVar27 = local_3c8;
  uStack_3c0 = local_708._8_8_;
  uVar28 = uStack_3c0;
  local_3d8 = local_6f8._0_8_;
  uVar25 = local_3d8;
  uStack_3d0 = local_6f8._8_8_;
  uVar26 = uStack_3d0;
  local_3c8._0_4_ = auVar38._0_4_;
  local_3c8._4_4_ = auVar38._4_4_;
  uStack_3c0._0_4_ = auVar38._8_4_;
  uStack_3c0._4_4_ = auVar38._12_4_;
  local_3d8._0_4_ = auVar39._0_4_;
  local_3d8._4_4_ = auVar39._4_4_;
  uStack_3d0._0_4_ = auVar39._8_4_;
  uStack_3d0._4_4_ = auVar39._12_4_;
  local_708._4_4_ = local_3c8._4_4_ + local_3d8._4_4_;
  local_708._0_4_ = (int)local_3c8 + (int)local_3d8;
  local_708._8_4_ = (int)uStack_3c0 + (int)uStack_3d0;
  local_708._12_4_ = uStack_3c0._4_4_ + uStack_3d0._4_4_;
  local_3e8 = local_708._0_8_;
  uStack_3e0 = local_708._8_8_;
  local_708._0_4_ = (int)local_3c8 + (int)local_3d8 + local_260;
  local_708._4_4_ = local_3c8._4_4_ + local_3d8._4_4_ + local_260;
  iVar41 = (int)uStack_3c0 + (int)uStack_3d0 + local_260;
  iVar42 = uStack_3c0._4_4_ + uStack_3d0._4_4_ + local_260;
  local_708._8_4_ = iVar41;
  local_708._12_4_ = iVar42;
  local_528 = local_708._0_8_;
  uStack_520 = local_708._8_8_;
  local_52c = local_5e4;
  auVar38 = ZEXT416(local_5e4);
  iVar37 = (int)local_708._0_4_ >> auVar38;
  iVar40 = (int)local_708._4_4_ >> auVar38;
  iVar41 = iVar41 >> auVar38;
  iVar42 = iVar42 >> auVar38;
  local_708._4_4_ = iVar40;
  local_708._0_4_ = iVar37;
  local_218 = local_708._0_8_;
  local_708._8_4_ = iVar41;
  local_708._12_4_ = iVar42;
  uStack_210 = local_708._8_8_;
  local_6a8 = local_708._0_8_;
  uStack_6a0 = local_708._8_8_;
  local_198 = CONCAT44(iStack_6e4,local_6e8);
  uStack_190 = CONCAT44(iStack_6dc,iStack_6e0);
  auVar10._8_8_ = uStack_190;
  auVar10._0_8_ = local_198;
  auVar9._8_8_ = uStack_630;
  auVar9._0_8_ = local_638;
  local_718 = pmulld(auVar10,auVar9);
  local_1b8 = CONCAT44(iStack_6d4,local_6d8);
  uStack_1b0 = CONCAT44(iStack_6cc,iStack_6d0);
  auVar8._8_8_ = uStack_1b0;
  auVar8._0_8_ = local_1b8;
  auVar7._8_8_ = uStack_620;
  auVar7._0_8_ = local_628;
  auVar38 = pmulld(auVar8,auVar7);
  local_6f8._0_8_ = auVar38._0_8_;
  local_6f8._8_8_ = auVar38._8_8_;
  local_2a8 = local_718._0_8_;
  uVar33 = local_2a8;
  uStack_2a0 = local_718._8_8_;
  uVar34 = uStack_2a0;
  local_2b8 = local_6f8._0_8_;
  uVar31 = local_2b8;
  uStack_2b0 = local_6f8._8_8_;
  uVar32 = uStack_2b0;
  local_2a8._0_4_ = local_718._0_4_;
  local_2a8._4_4_ = local_718._4_4_;
  uStack_2a0._0_4_ = local_718._8_4_;
  uStack_2a0._4_4_ = local_718._12_4_;
  local_2b8._0_4_ = auVar38._0_4_;
  local_2b8._4_4_ = auVar38._4_4_;
  uStack_2b0._0_4_ = auVar38._8_4_;
  uStack_2b0._4_4_ = auVar38._12_4_;
  local_408 = CONCAT44(local_2a8._4_4_ - local_2b8._4_4_,(int)local_2a8 - (int)local_2b8);
  uStack_400 = CONCAT44(uStack_2a0._4_4_ - uStack_2b0._4_4_,(int)uStack_2a0 - (int)uStack_2b0);
  local_698 = ((int)local_2a8 - (int)local_2b8) + local_260;
  iStack_694 = (local_2a8._4_4_ - local_2b8._4_4_) + local_260;
  iStack_690 = ((int)uStack_2a0 - (int)uStack_2b0) + local_260;
  iStack_68c = (uStack_2a0._4_4_ - uStack_2b0._4_4_) + local_260;
  local_548 = CONCAT44(iStack_694,local_698);
  uStack_540 = CONCAT44(iStack_68c,iStack_690);
  local_54c = local_5e4;
  auVar38 = ZEXT416(local_5e4);
  local_698 = local_698 >> auVar38;
  iStack_694 = iStack_694 >> auVar38;
  iStack_690 = iStack_690 >> auVar38;
  iStack_68c = iStack_68c >> auVar38;
  local_1d8 = CONCAT44(iStack_6e4,local_6e8);
  uStack_1d0 = CONCAT44(iStack_6dc,iStack_6e0);
  auVar6._8_8_ = uStack_1d0;
  auVar6._0_8_ = local_1d8;
  auVar5._8_8_ = uStack_640;
  auVar5._0_8_ = local_648;
  auVar38 = pmulld(auVar6,auVar5);
  local_1f8 = CONCAT44(iStack_6d4,local_6d8);
  uStack_1f0 = CONCAT44(iStack_6cc,iStack_6d0);
  auVar4._8_8_ = uStack_1f0;
  auVar4._0_8_ = local_1f8;
  auVar3._8_8_ = uStack_640;
  auVar3._0_8_ = local_648;
  auVar39 = pmulld(auVar4,auVar3);
  local_708._0_8_ = auVar38._0_8_;
  local_708._8_8_ = auVar38._8_8_;
  local_6f8._0_8_ = auVar39._0_8_;
  local_6f8._8_8_ = auVar39._8_8_;
  local_428 = local_708._0_8_;
  uVar23 = local_428;
  uStack_420 = local_708._8_8_;
  uVar24 = uStack_420;
  local_438 = local_6f8._0_8_;
  uVar21 = local_438;
  uStack_430 = local_6f8._8_8_;
  uVar22 = uStack_430;
  local_428._0_4_ = auVar38._0_4_;
  local_428._4_4_ = auVar38._4_4_;
  uStack_420._0_4_ = auVar38._8_4_;
  uStack_420._4_4_ = auVar38._12_4_;
  local_438._0_4_ = auVar39._0_4_;
  local_438._4_4_ = auVar39._4_4_;
  uStack_430._0_4_ = auVar39._8_4_;
  uStack_430._4_4_ = auVar39._12_4_;
  local_448 = CONCAT44(local_428._4_4_ + local_438._4_4_,(int)local_428 + (int)local_438);
  uStack_440 = CONCAT44(uStack_420._4_4_ + uStack_430._4_4_,(int)uStack_420 + (int)uStack_430);
  local_6c8 = (int)local_428 + (int)local_438 + local_260;
  iStack_6c4 = local_428._4_4_ + local_438._4_4_ + local_260;
  iStack_6c0 = (int)uStack_420 + (int)uStack_430 + local_260;
  iStack_6bc = uStack_420._4_4_ + uStack_430._4_4_ + local_260;
  local_568 = CONCAT44(iStack_6c4,local_6c8);
  uStack_560 = CONCAT44(iStack_6bc,iStack_6c0);
  local_56c = local_5e4;
  auVar38 = ZEXT416(local_5e4);
  local_6c8 = local_6c8 >> auVar38;
  iStack_6c4 = iStack_6c4 >> auVar38;
  iStack_6c0 = iStack_6c0 >> auVar38;
  iStack_6bc = iStack_6bc >> auVar38;
  local_2c8 = local_708._0_8_;
  uStack_2c0 = local_708._8_8_;
  local_2d8 = local_6f8._0_8_;
  uStack_2d0 = local_6f8._8_8_;
  local_468 = CONCAT44(local_428._4_4_ - local_438._4_4_,(int)local_428 - (int)local_438);
  uStack_460 = CONCAT44(uStack_420._4_4_ - uStack_430._4_4_,(int)uStack_420 - (int)uStack_430);
  local_6b8 = ((int)local_428 - (int)local_438) + local_260;
  iStack_6b4 = (local_428._4_4_ - local_438._4_4_) + local_260;
  iStack_6b0 = ((int)uStack_420 - (int)uStack_430) + local_260;
  iStack_6ac = (uStack_420._4_4_ - uStack_430._4_4_) + local_260;
  local_588 = CONCAT44(iStack_6b4,local_6b8);
  uStack_580 = CONCAT44(iStack_6ac,iStack_6b0);
  local_58c = local_5e4;
  auVar38 = ZEXT416(local_5e4);
  local_6b8 = local_6b8 >> auVar38;
  iStack_6b4 = iStack_6b4 >> auVar38;
  iStack_6b0 = iStack_6b0 >> auVar38;
  iStack_6ac = iStack_6ac >> auVar38;
  auVar2._8_8_ = uStack_210;
  auVar2._0_8_ = local_218;
  auVar1._8_8_ = uStack_640;
  auVar1._0_8_ = local_648;
  local_708 = pmulld(auVar2,auVar1);
  local_238 = CONCAT44(iStack_694,local_698);
  uStack_230 = CONCAT44(iStack_68c,iStack_690);
  auVar39._8_8_ = uStack_230;
  auVar39._0_8_ = local_238;
  auVar38._8_8_ = uStack_640;
  auVar38._0_8_ = local_648;
  local_6f8 = pmulld(auVar39,auVar38);
  local_488 = local_708._0_8_;
  uVar19 = local_488;
  uStack_480 = local_708._8_8_;
  uVar20 = uStack_480;
  local_498 = local_6f8._0_8_;
  uVar17 = local_498;
  uStack_490 = local_6f8._8_8_;
  uVar18 = uStack_490;
  local_488._0_4_ = local_708._0_4_;
  local_488._4_4_ = local_708._4_4_;
  uStack_480._0_4_ = local_708._8_4_;
  uStack_480._4_4_ = local_708._12_4_;
  local_498._0_4_ = local_6f8._0_4_;
  local_498._4_4_ = local_6f8._4_4_;
  uStack_490._0_4_ = local_6f8._8_4_;
  uStack_490._4_4_ = local_6f8._12_4_;
  local_4a8 = CONCAT44(local_488._4_4_ + local_498._4_4_,(int)local_488 + (int)local_498);
  uStack_4a0 = CONCAT44(uStack_480._4_4_ + uStack_490._4_4_,(int)uStack_480 + (int)uStack_490);
  local_688 = (int)local_488 + (int)local_498 + local_260;
  iStack_684 = local_488._4_4_ + local_498._4_4_ + local_260;
  iStack_680 = (int)uStack_480 + (int)uStack_490 + local_260;
  iStack_67c = uStack_480._4_4_ + uStack_490._4_4_ + local_260;
  local_5a8 = CONCAT44(iStack_684,local_688);
  uStack_5a0 = CONCAT44(iStack_67c,iStack_680);
  local_5ac = local_5e4;
  auVar38 = ZEXT416(local_5e4);
  local_688 = local_688 >> auVar38;
  iStack_684 = iStack_684 >> auVar38;
  iStack_680 = iStack_680 >> auVar38;
  iStack_67c = iStack_67c >> auVar38;
  local_2e8 = local_708._0_8_;
  uStack_2e0 = local_708._8_8_;
  local_2f8 = local_6f8._0_8_;
  uStack_2f0 = local_6f8._8_8_;
  local_4c8 = CONCAT44(local_488._4_4_ - local_498._4_4_,(int)local_488 - (int)local_498);
  uStack_4c0 = CONCAT44(uStack_480._4_4_ - uStack_490._4_4_,(int)uStack_480 - (int)uStack_490);
  local_678 = ((int)local_488 - (int)local_498) + local_260;
  iStack_674 = (local_488._4_4_ - local_498._4_4_) + local_260;
  iStack_670 = ((int)uStack_480 - (int)uStack_490) + local_260;
  iStack_66c = (uStack_480._4_4_ - uStack_490._4_4_) + local_260;
  local_5c8 = CONCAT44(iStack_674,local_678);
  uStack_5c0 = CONCAT44(iStack_66c,iStack_670);
  local_5cc = local_5e4;
  auVar38 = ZEXT416(local_5e4);
  local_678 = local_678 >> auVar38;
  iStack_674 = iStack_674 >> auVar38;
  iStack_670 = iStack_670 >> auVar38;
  iStack_66c = iStack_66c >> auVar38;
  if (local_5e8 == 0) {
    if (local_5ec + 6 < 0x10) {
      iVar37 = 0x10;
    }
    else {
      iVar37 = local_5ec + 6;
    }
    local_71c._0_1_ = (char)iVar37;
    local_264 = -(1 << ((char)local_71c - 1U & 0x1f));
    local_738 = CONCAT44(local_264,local_264);
    uStack_730 = CONCAT44(local_264,local_264);
    local_268 = (1 << ((char)local_71c - 1U & 0x1f)) + -1;
    uVar43 = CONCAT44(local_268,local_268);
    uStack_20 = CONCAT44(local_268,local_268);
    in0[1] = local_5e0 + 2;
    in1[1] = (longlong)&stack0xfffffffffffff8b8;
    in1[0] = (longlong)&local_738;
    in0[0] = (longlong)local_5e0;
    local_71c = iVar37;
    local_4d8 = local_658;
    uStack_4d0 = uStack_650;
    local_4b8 = local_658;
    uStack_4b0 = uStack_650;
    local_498 = uVar17;
    uStack_490 = uVar18;
    local_488 = uVar19;
    uStack_480 = uVar20;
    local_478 = local_658;
    uStack_470 = uStack_650;
    local_458 = local_658;
    uStack_450 = uStack_650;
    local_438 = uVar21;
    uStack_430 = uVar22;
    local_428 = uVar23;
    uStack_420 = uVar24;
    local_418 = local_658;
    uStack_410 = uStack_650;
    local_3f8 = local_658;
    uStack_3f0 = uStack_650;
    local_3d8 = uVar25;
    uStack_3d0 = uVar26;
    local_3c8 = uVar27;
    uStack_3c0 = uVar28;
    local_3b8 = local_658;
    uStack_3b0 = uStack_650;
    local_398 = local_658;
    uStack_390 = uStack_650;
    local_388 = uVar29;
    uStack_380 = uVar30;
    local_2b8 = uVar31;
    uStack_2b0 = uVar32;
    local_2a8 = uVar33;
    uStack_2a0 = uVar34;
    local_298 = uVar35;
    uStack_290 = uVar36;
    local_248 = local_648;
    uStack_240 = uStack_640;
    local_228 = local_648;
    uStack_220 = uStack_640;
    local_208 = local_648;
    uStack_200 = uStack_640;
    local_1e8 = local_648;
    uStack_1e0 = uStack_640;
    local_1c8 = local_628;
    uStack_1c0 = uStack_620;
    local_1a8 = local_638;
    uStack_1a0 = uStack_630;
    local_188 = local_638;
    uStack_180 = uStack_630;
    local_168 = local_628;
    uStack_160 = uStack_620;
    local_148 = local_608;
    uStack_140 = uStack_600;
    local_128 = local_618;
    uStack_120 = uStack_610;
    local_108 = local_608;
    uStack_100 = uStack_600;
    local_f8 = local_24c;
    local_f4 = local_24c;
    local_f0 = local_24c;
    local_ec = local_24c;
    local_e8 = local_618;
    uStack_e0 = uStack_610;
    local_d8 = local_250;
    local_d4 = local_250;
    local_d0 = local_250;
    local_cc = local_250;
    local_c8 = local_628;
    uStack_c0 = uStack_620;
    local_b8 = local_254;
    local_b4 = local_254;
    local_b0 = local_254;
    local_ac = local_254;
    local_a8 = local_638;
    uStack_a0 = uStack_630;
    local_98 = local_258;
    local_94 = local_258;
    local_90 = local_258;
    local_8c = local_258;
    local_88 = local_648;
    uStack_80 = uStack_640;
    local_78 = local_25c;
    local_74 = local_25c;
    local_70 = local_25c;
    local_6c = local_25c;
    local_68 = local_658;
    uStack_60 = uStack_650;
    local_58 = local_260;
    local_54 = local_260;
    local_50 = local_260;
    local_4c = local_260;
    local_48 = local_738;
    uStack_40 = uStack_730;
    local_38 = local_264;
    local_34 = local_264;
    local_30 = local_264;
    local_2c = local_264;
    local_28 = uVar43;
    local_10 = local_268;
    local_c = local_268;
    local_8 = local_268;
    local_4 = local_268;
    neg_shift_sse4_1(in0,in1,(__m128i *)(ulong)local_5f0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff8a8,
                     (__m128i *)CONCAT44(iVar37,in_stack_fffffffffffff8b0),local_268);
    in0_00[0] = local_5e0 + 4;
    in0_00[1] = local_5e0 + 6;
    iVar40 = (int)uVar43;
    in1_00[1] = (longlong)&stack0xfffffffffffff8b8;
    in1_00[0] = (longlong)&local_738;
    neg_shift_sse4_1(in0_00,in1_00,(__m128i *)(ulong)local_5f0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff8a8,
                     (__m128i *)CONCAT44(iVar37,in_stack_fffffffffffff8b0),iVar40);
    in0_01[0] = local_5e0 + 8;
    in0_01[1] = local_5e0 + 10;
    in1_01[1] = (longlong)&stack0xfffffffffffff8b8;
    in1_01[0] = (longlong)&local_738;
    neg_shift_sse4_1(in0_01,in1_01,(__m128i *)(ulong)local_5f0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff8a8,
                     (__m128i *)CONCAT44(iVar37,in_stack_fffffffffffff8b0),iVar40);
    in0_02[0] = local_5e0 + 0xc;
    in0_02[1] = local_5e0 + 0xe;
    in1_02[1] = (longlong)&stack0xfffffffffffff8b8;
    in1_02[0] = (longlong)&local_738;
    neg_shift_sse4_1(in0_02,in1_02,(__m128i *)(ulong)local_5f0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff8a8,
                     (__m128i *)CONCAT44(iVar37,in_stack_fffffffffffff8b0),iVar40);
  }
  else {
    *local_5e0 = CONCAT44(iStack_6e4,local_6e8);
    local_5e0[1] = CONCAT44(iStack_6dc,iStack_6e0);
    *(int *)(local_5e0 + 2) = -iVar37;
    *(int *)((long)local_5e0 + 0x14) = -iVar40;
    *(int *)(local_5e0 + 3) = -iVar41;
    *(int *)((long)local_5e0 + 0x1c) = -iVar42;
    local_5e0[4] = CONCAT44(iStack_684,local_688);
    local_5e0[5] = CONCAT44(iStack_67c,iStack_680);
    *(int *)(local_5e0 + 6) = -local_6c8;
    *(int *)((long)local_5e0 + 0x34) = -iStack_6c4;
    *(int *)(local_5e0 + 7) = -iStack_6c0;
    *(int *)((long)local_5e0 + 0x3c) = -iStack_6bc;
    local_5e0[8] = CONCAT44(iStack_6b4,local_6b8);
    local_5e0[9] = CONCAT44(iStack_6ac,iStack_6b0);
    *(int *)(local_5e0 + 10) = -local_678;
    *(int *)((long)local_5e0 + 0x54) = -iStack_674;
    *(int *)(local_5e0 + 0xb) = -iStack_670;
    *(int *)((long)local_5e0 + 0x5c) = -iStack_66c;
    local_5e0[0xc] = CONCAT44(iStack_694,local_698);
    local_5e0[0xd] = CONCAT44(iStack_68c,iStack_690);
    *(int *)(local_5e0 + 0xe) = -local_6d8;
    *(int *)((long)local_5e0 + 0x74) = -iStack_6d4;
    *(int *)(local_5e0 + 0xf) = -iStack_6d0;
    *(int *)((long)local_5e0 + 0x7c) = -iStack_6cc;
  }
  return;
}

Assistant:

static void iadst8x8_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                 int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i kZero = _mm_setzero_si128();
  __m128i u[8], x;

  // stage 0
  // stage 1
  // stage 2

  x = _mm_mullo_epi32(in[0], cospi60);
  u[0] = _mm_add_epi32(x, rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  x = _mm_mullo_epi32(in[0], cospi4);
  u[1] = _mm_sub_epi32(kZero, x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // stage 3
  // stage 4
  __m128i temp1, temp2;
  temp1 = _mm_mullo_epi32(u[0], cospi16);
  x = _mm_mullo_epi32(u[1], cospi48);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);
  u[4] = temp1;

  temp2 = _mm_mullo_epi32(u[0], cospi48);
  x = _mm_mullo_epi32(u[1], cospi16);
  u[5] = _mm_sub_epi32(temp2, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // stage 5
  // stage 6
  temp1 = _mm_mullo_epi32(u[0], cospi32);
  x = _mm_mullo_epi32(u[1], cospi32);
  u[2] = _mm_add_epi32(temp1, x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(temp1, x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  temp1 = _mm_mullo_epi32(u[4], cospi32);
  x = _mm_mullo_epi32(u[5], cospi32);
  u[6] = _mm_add_epi32(temp1, x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(temp1, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
  }
}